

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=(string<unsigned_short> *this,char *c)

{
  s32 l;
  uint uVar1;
  unsigned_short *puVar2;
  long lVar3;
  unsigned_short *puVar4;
  long lVar5;
  bool bVar6;
  
  puVar4 = this->array;
  if (c == (char *)0x0) {
    if (puVar4 == (unsigned_short *)0x0) {
      puVar4 = (unsigned_short *)operator_new__(2);
      this->array = puVar4;
      this->allocated = 1;
      this->used = 1;
    }
    *puVar4 = 0;
  }
  else if (puVar4 != (unsigned_short *)c) {
    uVar1 = 2;
    for (lVar5 = 1; c[lVar5 + -1] != '\0'; lVar5 = lVar5 + 1) {
      uVar1 = uVar1 + 2;
    }
    this->used = (s32)lVar5;
    this->allocated = (s32)lVar5;
    puVar2 = (unsigned_short *)operator_new__((ulong)uVar1);
    this->array = puVar2;
    lVar3 = 0;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      this->array[lVar3] = (short)c[lVar3];
      lVar3 = lVar3 + 1;
    }
    if (puVar4 != (unsigned_short *)0x0) {
      operator_delete__(puVar4);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}